

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void kratos::check_mixed_assignment(Generator *top)

{
  undefined1 local_58 [8];
  MixedAssignmentVisitor visitor;
  Generator *top_local;
  
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)top;
  MixedAssignmentVisitor::MixedAssignmentVisitor((MixedAssignmentVisitor *)local_58);
  IRVisitor::visit_generator_root_tp
            ((IRVisitor *)local_58,
             (Generator *)visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
  MixedAssignmentVisitor::~MixedAssignmentVisitor((MixedAssignmentVisitor *)local_58);
  return;
}

Assistant:

void check_mixed_assignment(Generator* top) {
    MixedAssignmentVisitor visitor;
    visitor.visit_generator_root_tp(top);
}